

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuslistener.cpp
# Opt level: O0

void __thiscall QDBusListener::saveJson(QDBusListener *this,QString *fileName)

{
  bool bVar1;
  ulong uVar2;
  DBusKey *pDVar3;
  QString *in_RSI;
  const_iterator *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  ChangeSignal *csig;
  DBusKey *dkey;
  QJsonDocument doc;
  QJsonObject root;
  QJsonObject obj;
  QJsonObject obj_1;
  const_iterator sig;
  QJsonArray sigs;
  QFile file;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_fffffffffffffd68;
  OpenModeFlag in_stack_fffffffffffffd6c;
  undefined1 in_stack_fffffffffffffd78 [16];
  undefined1 in_stack_fffffffffffffd88 [16];
  undefined1 in_stack_fffffffffffffdb8 [16];
  undefined1 local_200 [24];
  undefined1 *local_1e8;
  undefined1 local_1e0 [16];
  undefined1 *local_1d0;
  undefined1 local_1c8 [16];
  undefined1 *local_1b8;
  undefined1 local_1b0 [16];
  QMetaEnum local_1a0;
  QLatin1String *local_190;
  undefined1 local_180 [16];
  QMetaEnum local_170;
  QLatin1String *local_160;
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 *local_130;
  const_iterator local_128;
  const_iterator local_118;
  undefined1 *local_108 [5];
  QDebug local_e0 [2];
  undefined1 *local_d0;
  undefined1 *local_c8;
  QJsonValue local_c0 [24];
  QJsonValue local_a8 [24];
  QJsonValue local_90 [24];
  QJsonValue local_78 [24];
  QJsonValue local_60 [24];
  QJsonValue local_48 [24];
  QJsonValue local_30 [24];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_d0 = &DAT_aaaaaaaaaaaaaaaa;
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_d0,in_RSI);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)in_RDI,in_stack_fffffffffffffd6c);
  uVar2 = QFile::open((QFlags_conflict *)&local_d0);
  if ((uVar2 & 1) == 0) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    lcQpaThemeDBus();
    anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_RDI,
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_18);
      if (!bVar1) break;
      anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0xb253cd);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffd78._8_8_,in_stack_fffffffffffffd78._0_8_,
                 (int)((ulong)in_RDI >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                 (char *)0xb253e6);
      QMessageLogger::warning();
      QDebug::operator<<(in_stack_fffffffffffffd78._8_8_,in_stack_fffffffffffffd78._0_8_);
      QDebug::operator<<(in_stack_fffffffffffffd88._0_8_,in_stack_fffffffffffffdb8._0_8_);
      QDebug::~QDebug(local_e0);
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
  }
  else {
    local_108[0] = &DAT_aaaaaaaaaaaaaaaa;
    QJsonArray::QJsonArray((QJsonArray *)local_108);
    local_118.i = (size_type)&DAT_aaaaaaaaaaaaaaaa;
    local_118.c = (containers *)&DAT_aaaaaaaaaaaaaaaa;
    local_118 = QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
                ::constBegin((QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
                              *)0xb25491);
    while( true ) {
      local_128 = QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
                  ::constEnd((QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
                              *)0xb254af);
      bVar1 = QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
              ::const_iterator::operator!=
                        (in_RDI,(const_iterator *)
                                CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      if (!bVar1) break;
      pDVar3 = QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
               ::const_iterator::key((const_iterator *)0xb254f9);
      QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
      ::const_iterator::value((const_iterator *)0xb2551a);
      local_130 = &DAT_aaaaaaaaaaaaaaaa;
      QJsonObject::QJsonObject((QJsonObject *)&local_130);
      QJsonValue::QJsonValue(local_30,(QString *)pDVar3);
      anon_unknown.dwarf_1f37634::JsonKeys::dbusLocation();
      auVar4 = QJsonObject::operator[]((QLatin1String *)&local_130);
      local_140 = auVar4;
      QJsonValueRef::operator=((QJsonValueRef *)local_140,local_30);
      QJsonValue::~QJsonValue(local_30);
      QJsonValue::QJsonValue(local_48,(QString *)&pDVar3->key);
      anon_unknown.dwarf_1f37634::JsonKeys::dbusKey();
      auVar4 = QJsonObject::operator[]((QLatin1String *)&local_130);
      local_150 = auVar4;
      QJsonValueRef::operator=((QJsonValueRef *)local_150,local_48);
      QJsonValue::~QJsonValue(local_48);
      local_170 = QMetaEnum::fromType<QDBusListener::Provider>();
      QMetaEnum::valueToKey((ulonglong)&local_170);
      QLatin1String::QLatin1String(in_stack_fffffffffffffd78._8_8_,in_stack_fffffffffffffd78._0_8_);
      QJsonValue::QJsonValue(local_60,local_160);
      anon_unknown.dwarf_1f37634::JsonKeys::provider();
      auVar4 = QJsonObject::operator[]((QLatin1String *)&local_130);
      local_180 = auVar4;
      QJsonValueRef::operator=((QJsonValueRef *)local_180,local_60);
      QJsonValue::~QJsonValue(local_60);
      local_1a0 = QMetaEnum::fromType<QDBusListener::Setting>();
      QMetaEnum::valueToKey((ulonglong)&local_1a0);
      QLatin1String::QLatin1String(in_stack_fffffffffffffd78._8_8_,in_stack_fffffffffffffd78._0_8_);
      QJsonValue::QJsonValue(local_78,local_190);
      anon_unknown.dwarf_1f37634::JsonKeys::setting();
      auVar4 = QJsonObject::operator[]((QLatin1String *)&local_130);
      local_1b0 = auVar4;
      QJsonValueRef::operator=((QJsonValueRef *)local_1b0,local_78);
      QJsonValue::~QJsonValue(local_78);
      QJsonValue::QJsonValue(local_90,(QJsonObject *)&local_130);
      QJsonArray::append((QJsonValue *)local_108);
      QJsonValue::~QJsonValue(local_90);
      QJsonObject::~QJsonObject((QJsonObject *)&local_130);
      QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
      ::const_iterator::operator++(&local_118);
    }
    local_1b8 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)&local_1b8);
    QJsonValue::QJsonValue(local_a8,(QJsonArray *)local_108);
    anon_unknown.dwarf_1f37634::JsonKeys::dbusSignals();
    local_1c8 = QJsonObject::operator[]((QLatin1String *)&local_1b8);
    QJsonValueRef::operator=((QJsonValueRef *)local_1c8,local_a8);
    QJsonValue::~QJsonValue(local_a8);
    local_1d0 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)&local_1d0);
    QJsonValue::QJsonValue(local_c0,(QJsonObject *)&local_1b8);
    anon_unknown.dwarf_1f37634::JsonKeys::root();
    local_1e0 = QJsonObject::operator[]((QLatin1String *)&local_1d0);
    QJsonValueRef::operator=((QJsonValueRef *)local_1e0,local_c0);
    QJsonValue::~QJsonValue(local_c0);
    local_1e8 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonDocument::QJsonDocument((QJsonDocument *)&local_1e8,(QJsonObject *)&local_1d0);
    QJsonDocument::toJson(local_200,&local_1e8,0);
    QIODevice::write((QByteArray *)&local_d0);
    QByteArray::~QByteArray((QByteArray *)0xb25937);
    QFileDevice::close();
    QJsonDocument::~QJsonDocument((QJsonDocument *)&local_1e8);
    QJsonObject::~QJsonObject((QJsonObject *)&local_1d0);
    QJsonObject::~QJsonObject((QJsonObject *)&local_1b8);
    QJsonArray::~QJsonArray((QJsonArray *)local_108);
  }
  QFile::~QFile((QFile *)&local_d0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDBusListener::saveJson(const QString &fileName) const
{
    Q_ASSERT(!m_signalMap.isEmpty());
    Q_ASSERT(!fileName.isEmpty());
    QFile file(fileName);
    if (!file.open(QIODevice::WriteOnly)) {
        qCWarning(lcQpaThemeDBus) << fileName << "could not be opened for writing.";
        return;
    }

    QJsonArray sigs;
    for (auto sig = m_signalMap.constBegin(); sig != m_signalMap.constEnd(); ++sig) {
        const DBusKey &dkey = sig.key();
        const ChangeSignal &csig = sig.value();
        QJsonObject obj;
        obj[JsonKeys::dbusLocation()] = dkey.location;
        obj[JsonKeys::dbusKey()] = dkey.key;
        obj[JsonKeys::provider()] = QLatin1StringView(QMetaEnum::fromType<Provider>()
                                            .valueToKey(static_cast<int>(csig.provider)));
        obj[JsonKeys::setting()] = QLatin1StringView(QMetaEnum::fromType<Setting>()
                                           .valueToKey(static_cast<int>(csig.setting)));
        sigs.append(obj);
    }
    QJsonObject obj;
    obj[JsonKeys::dbusSignals()] = sigs;
    QJsonObject root;
    root[JsonKeys::root()] = obj;
    QJsonDocument doc(root);
    file.write(doc.toJson());
    file.close();
}